

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O3

int __thiscall Clasp::Cli::ClaspAppBase::exitCode(ClaspAppBase *this,RunSummary *run)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *(uint *)&run->result;
  uVar2 = 10;
  if (((byte)uVar1 & 3) != 1) {
    uVar2 = 0;
  }
  uVar3 = uVar2 + 0x14;
  if ((uVar1 & 4) == 0) {
    uVar3 = uVar2;
  }
  return uVar1 >> 3 & 1 | uVar3;
}

Assistant:

int ClaspAppBase::exitCode(const RunSummary& run) const {
	int ec = 0;
	if (run.sat())               { ec |= E_SAT;       }
	if (run.complete())          { ec |= E_EXHAUST;   }
	if (run.result.interrupted()){ ec |= E_INTERRUPT; }
	return ec;
}